

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::CheckOpcode1(TypeChecker *this,Opcode opcode)

{
  Type TVar1;
  Result RVar2;
  char *desc;
  Opcode local_24 [2];
  Opcode opcode_local;
  
  TVar1 = Opcode::GetParamType1(local_24);
  desc = Opcode::GetName(local_24);
  RVar2 = PopAndCheck1Type(this,TVar1,desc);
  TVar1 = Opcode::GetResultType(local_24);
  PushType(this,TVar1);
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode1(Opcode opcode) {
  Result result = PopAndCheck1Type(opcode.GetParamType1(), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}